

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O1

Vec_Wec_t * Acec_ParseSignature(char *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  char *pcVar4;
  Vec_Wec_t *pVVar5;
  char *pStop;
  size_t sVar6;
  Vec_Wec_t *vM2;
  Vec_Wec_t *pVVar7;
  Vec_Wec_t *pVVar8;
  long lVar9;
  
  if (*p != '(') {
    sVar6 = strlen(p);
    lVar9 = sVar6 << 0x20;
    pcVar4 = (char *)malloc(lVar9 + 0x300000000 >> 0x20);
    *pcVar4 = '(';
    strcpy(pcVar4 + 1,p);
    pcVar4[lVar9 + 0x100000000 >> 0x20] = ')';
    pcVar4[lVar9 + 0x200000000 >> 0x20] = '\0';
    pVVar5 = Acec_ParseSignatureOne(pcVar4,pcVar4 + (long)(int)sVar6 + 1);
    free(pcVar4);
    return pVVar5;
  }
  pcVar4 = strchr(p,0x29);
  if (pcVar4 != (char *)0x0) {
    pVVar5 = Acec_ParseSignatureOne(p,pcVar4);
    if (pcVar4[1] == '\0') {
      return pVVar5;
    }
    if (pcVar4[1] != '*') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                    ,0x9b,"Vec_Wec_t *Acec_ParseSignature(char *)");
    }
    pStop = strchr(pcVar4 + 2,0x29);
    if (pStop != (char *)0x0 && pcVar4[2] == '(') {
      vM2 = Acec_ParseSignatureOne(pcVar4 + 2,pStop);
      if (pStop[1] != '+') {
        if (pStop[1] == '\0') {
          pVVar7 = Acec_ParseDistribute(pVVar5,vM2,(Vec_Wec_t *)0x0);
          iVar1 = pVVar5->nCap;
          if (0 < (long)iVar1) {
            pVVar2 = pVVar5->pArray;
            lVar9 = 0;
            do {
              pvVar3 = *(void **)((long)&pVVar2->pArray + lVar9);
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
                *(undefined8 *)((long)&pVVar2->pArray + lVar9) = 0;
              }
              lVar9 = lVar9 + 0x10;
            } while ((long)iVar1 * 0x10 != lVar9);
          }
          if (pVVar5->pArray != (Vec_Int_t *)0x0) {
            free(pVVar5->pArray);
            pVVar5->pArray = (Vec_Int_t *)0x0;
          }
          pVVar5->nCap = 0;
          pVVar5->nSize = 0;
          free(pVVar5);
          iVar1 = vM2->nCap;
          if (0 < (long)iVar1) {
            pVVar2 = vM2->pArray;
            lVar9 = 0;
            do {
              pvVar3 = *(void **)((long)&pVVar2->pArray + lVar9);
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
                *(undefined8 *)((long)&pVVar2->pArray + lVar9) = 0;
              }
              lVar9 = lVar9 + 0x10;
            } while ((long)iVar1 * 0x10 != lVar9);
          }
          if (vM2->pArray != (Vec_Int_t *)0x0) {
            free(vM2->pArray);
            vM2->pArray = (Vec_Int_t *)0x0;
          }
          vM2->nCap = 0;
          vM2->nSize = 0;
          free(vM2);
          return pVVar7;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                      ,0x99,"Vec_Wec_t *Acec_ParseSignature(char *)");
      }
      pcVar4 = strchr(pStop + 2,0x29);
      if (pcVar4 != (char *)0x0 && pStop[2] == '(') {
        pVVar7 = Acec_ParseSignatureOne(pStop + 2,pcVar4);
        pVVar8 = Acec_ParseDistribute(pVVar5,vM2,pVVar7);
        Vec_WecFree(pVVar5);
        Vec_WecFree(vM2);
        Vec_WecFree(pVVar7);
        return pVVar8;
      }
    }
  }
  return (Vec_Wec_t *)0x0;
}

Assistant:

Vec_Wec_t * Acec_ParseSignature( char * p )
{
    Vec_Wec_t * vAdd = NULL, * vTemp1, * vTemp2, * vRes;
    if ( p[0] == '(' )
    {
        char * pStop = strstr(p, ")");
        if ( pStop == NULL )
            return NULL;
        vTemp1 = Acec_ParseSignatureOne( p, pStop );
        if ( pStop[1] == 0 )
            return vTemp1;
        if ( pStop[1] == '*' )
        {
            char * p2 = pStop + 2;
            char * pStop2 = strstr(p2, ")");
            if ( p2[0] != '(' )
                return NULL;
            if ( pStop2 == NULL )
                return NULL;
            vTemp2 = Acec_ParseSignatureOne( p2, pStop2 );
            if ( pStop2[1] == 0 )
            {
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                return vRes;
            }
            if ( pStop2[1] == '+' )
            {
                char * p3 = pStop2 + 2;
                char * pStop3 = strstr(p3, ")");
                if ( p3[0] != '(' )
                    return NULL;
                if ( pStop3 == NULL )
                    return NULL;
                vAdd = Acec_ParseSignatureOne( p3, pStop3 );
                vRes = Acec_ParseDistribute( vTemp1, vTemp2, vAdd );
                Vec_WecFree( vTemp1 );
                Vec_WecFree( vTemp2 );
                Vec_WecFree( vAdd );
                return vRes;
            }
            assert( 0 );
        }
        assert( 0 );
    }
    else
    {
        int Len = strlen(p);
        char * pCopy = ABC_ALLOC( char, Len+3 );
        pCopy[0] = '(';
        strcpy( pCopy+1, p );
        pCopy[Len+1] = ')';
        pCopy[Len+2] = '\0';
        vRes = Acec_ParseSignatureOne( pCopy, pCopy + Len + 1 );
        ABC_FREE( pCopy );
        return vRes;
    }
    return NULL;
}